

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O2

bool __thiscall File::lock(File *this)

{
  byte bVar1;
  __pid_t _Var2;
  int iVar3;
  flock fl;
  
  this->_locked = false;
  if (this->_fh == (FILE *)0x0) {
    bVar1 = 0;
  }
  else if (this->_h == -1) {
    bVar1 = 0;
  }
  else {
    fl.l_len = 0;
    fl.l_pid = 0;
    fl._28_4_ = 0;
    fl.l_type = 1;
    fl.l_whence = 0;
    fl._4_4_ = 0;
    fl.l_start = 0;
    _Var2 = getpid();
    fl.l_pid = _Var2;
    iVar3 = fcntl(this->_h,7,&fl);
    if (iVar3 == 0) {
      this->_locked = true;
      bVar1 = 1;
    }
    else {
      bVar1 = this->_locked;
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool File::lock ()
{
  _locked = false;
  if (_fh && _h != -1)
  {
#if defined(DARWIN)
                    // l_start l_len l_pid l_type   l_whence
    struct flock fl = {0,      0,    0,    F_WRLCK, SEEK_SET};
#elif defined(FREEBSD)
                    // l_type   l_whence  l_start  l_len  l_pid  l_sysid
    struct flock fl = {F_WRLCK, SEEK_SET, 0,       0,     0,     0 };
#else
                    // l_type   l_whence  l_start  l_len  l_pid
    struct flock fl = {F_WRLCK, SEEK_SET, 0,       0,     0 };
#endif
    fl.l_pid = getpid ();
    if (fcntl (_h, F_SETLKW, &fl) == 0)
      _locked = true;
  }

  return _locked;
}